

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

string * __thiscall
tinyusdz::value::GetTypeName_abi_cxx11_(string *__return_storage_ptr__,value *this,uint32_t tyid)

{
  long lVar1;
  char cVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  uint uVar7;
  ulong uVar8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ret;
  string __str;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  char local_70;
  anon_struct_8_0_00000001_for___align local_68;
  long local_60;
  ulong local_58;
  undefined8 uStack_50;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  TryGetTypeName_abi_cxx11_(&local_98,this,tyid);
  local_70 = local_98.has_value_;
  if (local_98.has_value_ == true) {
    lVar1 = (long)&local_98.contained + 0x10;
    if (local_98.contained.data.__align == (anon_struct_8_0_00000001_for___align)lVar1) {
      uStack_50 = local_98.contained._24_8_;
      local_68 = (anon_struct_8_0_00000001_for___align)&local_58;
    }
    else {
      local_68 = local_98.contained.data.__align;
    }
    local_58 = local_98.contained._16_8_;
    local_60 = local_98.contained._8_8_;
    local_98.contained._8_8_ = 0;
    local_98.contained._16_8_ = local_98.contained._16_8_ & 0xffffffffffffff00;
    local_98.contained.data._0_8_ = (undefined8)lVar1;
  }
  if (local_98.has_value_ == false) {
    cVar3 = '\x01';
    if (9 < (uint)this) {
      uVar8 = (ulong)this & 0xffffffff;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_002c5343;
        }
        if (uVar7 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_002c5343;
        }
        if (uVar7 < 10000) goto LAB_002c5343;
        uVar8 = uVar8 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (99999 < uVar7);
      cVar3 = cVar3 + '\x01';
    }
LAB_002c5343:
    local_48 = local_38;
    ::std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_48,local_40,(uint)this);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x401a4a);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_98.contained._8_8_ = *plVar5;
      local_98.contained._16_8_ = plVar4[3];
      local_98._0_8_ = (long)&local_98 + 0x10U;
    }
    else {
      local_98.contained._8_8_ = *plVar5;
      local_98._0_8_ = (long *)*plVar4;
    }
    local_98.contained.data.__align = *(anon_struct_8_0_00000001_for___align *)(plVar4 + 1);
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append(&local_98.has_value_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar1 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_98._0_8_ != (long)&local_98 + 0x10U) {
      operator_delete((void *)local_98._0_8_,local_98.contained._8_8_ + 1);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_68,local_60 + (long)local_68);
  }
  if ((local_70 == '\x01') && (local_68 != (anon_struct_8_0_00000001_for___align)&local_58)) {
    operator_delete((void *)local_68,local_58 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeName(uint32_t tyid) {
  auto ret = TryGetTypeName(tyid);

  if (!ret) {
    return "(GetTypeName) [[Unknown or unimplemented/unsupported type_id: " +
           std::to_string(tyid) + "]]";
  }

  return ret.value();
}